

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeEventQueryKernelTimestamp(ze_event_handle_t hEvent,ze_kernel_timestamp_result_t *dstptr)

{
  ze_pfnEventQueryKernelTimestamp_t pfnQueryKernelTimestamp;
  ze_result_t result;
  ze_kernel_timestamp_result_t *dstptr_local;
  ze_event_handle_t hEvent_local;
  
  pfnQueryKernelTimestamp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c600 != (code *)0x0) {
    pfnQueryKernelTimestamp._4_4_ = (*DAT_0011c600)(hEvent,dstptr);
  }
  return pfnQueryKernelTimestamp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventQueryKernelTimestamp(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_kernel_timestamp_result_t* dstptr            ///< [in,out] pointer to memory for where timestamp result will be written.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnQueryKernelTimestamp = context.zeDdiTable.Event.pfnQueryKernelTimestamp;
        if( nullptr != pfnQueryKernelTimestamp )
        {
            result = pfnQueryKernelTimestamp( hEvent, dstptr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }